

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::uncheckedEnqueue(OnlineProofChecker *this,Lit p)

{
  int iVar1;
  ostream *poVar2;
  Lit local_14;
  
  local_14.x = p.x;
  if (3 < *(int *)(this + 0xf8)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue literal ");
    poVar2 = operator<<(poVar2,&local_14);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  *(byte *)(*(long *)(this + 0xd8) + (long)(local_14.x >> 1)) = (byte)local_14.x & 1;
  iVar1 = *(int *)(this + 0xc0);
  *(int *)(this + 0xc0) = iVar1 + 1;
  *(int *)(*(long *)(this + 0xb8) + (long)iVar1 * 4) = local_14.x;
  return;
}

Assistant:

inline void OnlineProofChecker::uncheckedEnqueue(Lit p)
{
    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] enqueue literal " << p << std::endl;);
    assigns[var(p)] = lbool(!sign(p));
    // prefetch watch lists
    __builtin_prefetch(&watches[p]);
    trail.push_(p);
}